

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O2

void duckdb::ModeFunction<duckdb::ModeString>::
     Window<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::string_t,duckdb::string_t>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t rid)

{
  ValidityMask *pVVar1;
  data_ptr_t pdVar2;
  ulong uVar3;
  long lVar4;
  pointer pFVar5;
  undefined8 uVar6;
  bool bVar7;
  Allocator *allocator;
  MAP_TYPE *pMVar8;
  reference pvVar9;
  const_reference pvVar10;
  const_iterator cVar11;
  data_ptr_t pdVar12;
  FrameBounds *frame;
  pointer pFVar13;
  byte bVar14;
  string_t sVar15;
  Updater updater;
  ModeIncluded<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>_> included;
  
  pdVar12 = l_state;
  ModeState<duckdb::string_t,_duckdb::ModeString>::InitializePage
            ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state,partition);
  pVVar1 = partition->filter_mask;
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (*(long *)l_state == *(long *)(l_state + 8)) {
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::resize
              ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,1);
  }
  pMVar8 = *(MAP_TYPE **)(l_state + 0x18);
  included.fmask = pVVar1;
  included.state = (ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state;
  if (pMVar8 == (MAP_TYPE *)0x0) {
    allocator = Allocator::DefaultAllocator();
    pMVar8 = ModeString::CreateEmpty(allocator);
    *(MAP_TYPE **)(l_state + 0x18) = pMVar8;
  }
  if ((pMVar8->map)._M_h._M_element_count >> 2 < *(ulong *)(l_state + 0x28)) {
    pvVar9 = vector<duckdb::FrameBounds,_true>::back((vector<duckdb::FrameBounds,_true> *)l_state);
    uVar3 = pvVar9->end;
    pvVar10 = vector<duckdb::FrameBounds,_true>::front(frames);
    if (pvVar10->start < uVar3) {
      pvVar10 = vector<duckdb::FrameBounds,_true>::back(frames);
      uVar3 = pvVar10->end;
      pvVar9 = vector<duckdb::FrameBounds,_true>::front
                         ((vector<duckdb::FrameBounds,_true> *)l_state);
      if (pvVar9->start < uVar3) {
        updater.included = &included;
        updater.state = (ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state;
        AggregateExecutor::
        IntersectFrames<duckdb::ModeFunction<duckdb::ModeString>::UpdateWindowState<duckdb::ModeState<duckdb::string_t,duckdb::ModeString>,duckdb::string_t>>
                  ((SubFrames *)l_state,frames,&updater);
        goto LAB_01c3473f;
      }
    }
  }
  ModeState<duckdb::string_t,_duckdb::ModeString>::Reset
            ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state);
  pFVar5 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
           super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pFVar13 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
                 super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                 _M_impl.super__Vector_impl_data._M_start; pFVar13 != pFVar5; pFVar13 = pFVar13 + 1)
  {
    for (updater.state = (ModeState<duckdb::string_t,_duckdb::ModeString> *)pFVar13->start;
        updater.state < (ModeState<duckdb::string_t,_duckdb::ModeString> *)pFVar13->end;
        updater.state =
             (ModeState<duckdb::string_t,_duckdb::ModeString> *)
             ((long)&((updater.state)->prevs).
                     super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                     _M_impl.super__Vector_impl_data._M_start + 1)) {
      bVar7 = ModeIncluded<duckdb::ModeState<duckdb::string_t,_duckdb::ModeString>_>::operator()
                        (&included,(idx_t *)&updater);
      if (bVar7) {
        ModeState<duckdb::string_t,_duckdb::ModeString>::ModeAdd
                  ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state,(idx_t)updater.state);
      }
    }
  }
LAB_01c3473f:
  bVar14 = l_state[0x30];
  if (bVar14 == 0) {
    cVar11 = ModeState<duckdb::string_t,_duckdb::ModeString>::Scan
                       ((ModeState<duckdb::string_t,_duckdb::ModeString> *)l_state);
    if (cVar11.super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>.
        _M_cur == (__node_type *)0x0) {
      bVar14 = l_state[0x30];
    }
    else {
      pdVar12 = *(data_ptr_t *)(l_state + 0x20);
      uVar6 = *(undefined8 *)
               ((long)cVar11.
                      super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                      ._M_cur + 0x10);
      *(undefined8 *)pdVar12 =
           *(undefined8 *)
            ((long)cVar11.
                   super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                   ._M_cur + 8);
      *(undefined8 *)(pdVar12 + 8) = uVar6;
      lVar4 = *(long *)((long)cVar11.
                              super__Node_iterator_base<std::pair<const_duckdb::string_t,_duckdb::ModeAttr>,_true>
                              ._M_cur + 0x18);
      *(long *)(l_state + 0x38) = lVar4;
      bVar14 = lVar4 != 0;
      l_state[0x30] = bVar14;
    }
  }
  if ((bVar14 & 1) == 0) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (&(result->validity).super_TemplatedValidityMask<unsigned_long>,rid);
  }
  else {
    sVar15.value.pointer.ptr = (char *)pdVar12;
    sVar15.value._0_8_ = (*(undefined8 **)(l_state + 0x20))[1];
    sVar15 = StringVector::AddStringOrBlob
                       ((StringVector *)result,(Vector *)**(undefined8 **)(l_state + 0x20),sVar15);
    *(long *)(pdVar2 + rid * 0x10) = sVar15.value._0_8_;
    *(long *)(pdVar2 + rid * 0x10 + 8) = sVar15.value._8_8_;
  }
  ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
            ((vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_> *)l_state,
             &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t rid) {
		auto &state = *reinterpret_cast<STATE *>(l_state);

		state.InitializePage(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
		auto &rmask = FlatVector::Validity(result);
		auto &prevs = state.prevs;
		if (prevs.empty()) {
			prevs.resize(1);
		}

		ModeIncluded<STATE> included(fmask, state);

		if (!state.frequency_map) {
			state.frequency_map = TYPE_OP::CreateEmpty(Allocator::DefaultAllocator());
		}
		const size_t tau_inverse = 4; // tau==0.25
		if (state.nonzero <= (state.frequency_map->size() / tau_inverse) || prevs.back().end <= frames.front().start ||
		    frames.back().end <= prevs.front().start) {
			state.Reset();
			// for f ∈ F do
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					if (included(i)) {
						state.ModeAdd(i);
					}
				}
			}
		} else {
			using Updater = UpdateWindowState<STATE, INPUT_TYPE>;
			Updater updater(state, included);
			AggregateExecutor::IntersectFrames(prevs, frames, updater);
		}

		if (!state.valid) {
			// Rescan
			auto highest_frequency = state.Scan();
			if (highest_frequency != state.frequency_map->end()) {
				*(state.mode) = highest_frequency->first;
				state.count = highest_frequency->second.count;
				state.valid = (state.count > 0);
			}
		}

		if (state.valid) {
			rdata[rid] = TYPE_OP::template Assign<INPUT_TYPE, RESULT_TYPE>(result, *state.mode);
		} else {
			rmask.Set(rid, false);
		}

		prevs = frames;
	}